

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

int bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  size_type *psVar1;
  mapped_type *pmVar2;
  undefined4 in_register_0000003c;
  long lVar3;
  int in_R8D;
  uint in_R9D;
  long local_68;
  Hcell h;
  
  lVar3 = CONCAT44(in_register_0000003c,__fd);
  if (in_R8D == 1) {
    psVar1 = &h.f_.id._M_string_length;
    h.f_.id._M_string_length._0_4_ = 0x62726167;
    h.f_.id._M_dataplus._M_p = (pointer)0x7;
    h.f_.id._M_string_length._4_4_ = 0x656761;
    h.f_.id.field_2._8_4_ = 0xffffffd6;
    local_68 = (ulong)in_R9D << 0x20;
    h._0_8_ = psVar1;
    if (__len == 1) {
      pmVar2 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
               operator[]((map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                           *)__addr,(key_type *)&h.f_.field_0x24);
      pmVar2->tag = (undefined4)local_68;
      pmVar2->hix_ = (Hix)local_68._4_4_;
      std::__cxx11::string::operator=((string *)&pmVar2->f_,(string *)&h);
      (pmVar2->f_).arity = h.f_.id.field_2._8_4_;
      if ((size_type *)h._0_8_ != psVar1) {
        operator_delete((void *)h._0_8_,
                        CONCAT44(h.f_.id._M_string_length._4_4_,(undefined4)h.f_.id._M_string_length
                                ) + 1);
      }
      std::_Rb_tree_header::_Rb_tree_header
                ((_Rb_tree_header *)(lVar3 + 8),(_Rb_tree_header *)(__addr->sa_data + 6));
      std::_Rb_tree_header::_Rb_tree_header
                ((_Rb_tree_header *)(lVar3 + 0x38),(_Rb_tree_header *)(__addr[3].sa_data + 6));
      *(undefined4 *)(lVar3 + 0x68) = *(undefined4 *)(__addr[6].sa_data + 6);
      *(undefined8 *)(lVar3 + 0x60) = *(undefined8 *)(__addr + 6);
      return __fd;
    }
  }
  __assert_fail("tag_ == AddrTag::Heap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                ,0xac,"Hix Addr::hix() const");
}

Assistant:

Machine bind(Machine m, Addr storeLoc, Addr toStore) {
    m.heap[storeLoc.hix()] = Hcell::ref(toStore.hix());
    return m;
}